

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

int __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
::FindEntry<Js::EntryPointInfo>
          (WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
           *this,EntryPointInfo *key)

{
  int **ppiVar1;
  int local_2c;
  hash_t local_28;
  int previous;
  uint bucket;
  hash_t hash;
  EntryPointInfo *key_local;
  WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
  *this_local;
  
  _bucket = key;
  key_local = (EntryPointInfo *)this;
  ppiVar1 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&this->buckets);
  if (*ppiVar1 == (int *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    previous = GetHashCode<Js::EntryPointInfo>(this,_bucket);
    local_28 = PrimePolicy::GetBucket(previous,this->size,this->modFunctionIndex);
    local_2c = -1;
    this_local._4_4_ = FindEntry<Js::EntryPointInfo>(this,_bucket,previous,&local_28,&local_2c);
  }
  return this_local._4_4_;
}

Assistant:

inline int FindEntry(const TLookup* key)
        {
            if (buckets != nullptr)
            {
                hash_t hash = GetHashCode(key);
                uint bucket = PrimePolicy::GetBucket(hash, size, modFunctionIndex);
                int previous = -1;
                return FindEntry(key, hash, bucket, previous);
            }

            return -1;
        }